

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pStateChangeCallTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::StateChangeCallTests::init(StateChangeCallTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  StateChangeCallPerformanceCase *pSVar2;
  
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"enable","Test cost of glEnable() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e2f0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"disable","Test cost of glDisable() calls"
            );
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e348;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"depth_func",
             "Test cost of glDepthFunc() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e3a0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"depth_mask",
             "Test cost of glDepthMask() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e3f8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"stencil_mask",
             "Test cost of glStencilMask() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e450;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"clear_depth",
             "Test cost of glClearDepth() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e4a8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"clear_stencil",
             "Test cost of glClearStencil() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"line_width",
             "Test cost of glLineWidth() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e558;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"cull_face",
             "Test cost of glCullFace() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e5b0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"front_face",
             "Test cost of glFrontFace() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e608;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"blend_equation",
             "Test cost of glBlendEquation() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e660;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"enable_vertex_attrib_array",
             "Test cost of glEnableVertexAttribArray() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e6b8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"disable_vertex_attrib_array",
             "Test cost of glDisableVertexAttribArray() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e710;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"use_program",
             "Test cost of glUseProgram() calls. Note: Uses only program 0.");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e768;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"active_texture",
             "Test cost of glActiveTexture() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e7c0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"depth_range",
             "Test cost of glDepthRangef() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e818;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"polygon_offset",
             "Test cost of glPolygonOffset() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e870;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"sample_coverage",
             "Test cost of glSampleCoverage() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e8c8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"blend_func",
             "Test cost of glBlendFunc() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e920;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"blend_equation_separate",
             "Test cost of glBlendEquationSeparate() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e978;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"stencil_mask_separate",
             "Test cost of glStencilMaskSeparate() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077e9d0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"bind_buffer",
             "Test cost of glBindBuffer() calls. Note: Uses only buffer 0");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ea28;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"bind_texture",
             "Test cost of glBindTexture() calls. Note: Uses only texture 0");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ea80;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"hint","Test cost of glHint() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ead8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"stencil_func",
             "Test cost of glStencilFunc() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077eb30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"stencil_op",
             "Test cost of glStencilOp() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077eb88;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"viewport",
             "Test cost of glViewport() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ebe0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"scissor","Test cost of glScissor() calls"
            );
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ec38;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"stencil_func_separate",
             "Test cost of glStencilFuncSeparate() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ec90;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"stencil_op_separatae",
             "Test cost of glStencilOpSeparate() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ece8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"blend_func_separate",
             "Test cost of glBlendFuncSeparate() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ed40;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"color_mask",
             "Test cost of glColorMask() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ed98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"clear_color",
             "Test cost of glClearColor() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077edf0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (StateChangeCallPerformanceCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::StateChangeCallPerformanceCase::StateChangeCallPerformanceCase
            (pSVar2,pCVar1->m_testCtx,pCVar1->m_renderCtx,"vertex_attrib_pointer",
             "Test cost of glVertexAttribPointer() calls");
  (pSVar2->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StateChangeCallPerformanceCase_0077ee48;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  return extraout_EAX;
}

Assistant:

void StateChangeCallTests::init (void)
{
	ADD_ARG_CASE1(enable, "Test cost of glEnable() calls",
		enable,
		GLenum,
		ARG_LIST({
			GL_CULL_FACE,
			GL_POLYGON_OFFSET_FILL,
			GL_SAMPLE_ALPHA_TO_COVERAGE,
			GL_SAMPLE_COVERAGE,
			GL_SCISSOR_TEST,
			GL_STENCIL_TEST,
			GL_DEPTH_TEST,
			GL_BLEND,
			GL_DITHER
		})
	);

	ADD_ARG_CASE1(disable, "Test cost of glDisable() calls",
		disable,
		GLenum,
		ARG_LIST({
			GL_CULL_FACE,
			GL_POLYGON_OFFSET_FILL,
			GL_SAMPLE_ALPHA_TO_COVERAGE,
			GL_SAMPLE_COVERAGE,
			GL_SCISSOR_TEST,
			GL_STENCIL_TEST,
			GL_DEPTH_TEST,
			GL_BLEND,
			GL_DITHER
		})
	);

	ADD_ARG_CASE1(depth_func, "Test cost of glDepthFunc() calls",
		depthFunc,
		GLenum,
		ARG_LIST({
			GL_NEVER,
			GL_ALWAYS,
			GL_LESS,
			GL_LEQUAL,
			GL_EQUAL,
			GL_GREATER,
			GL_GEQUAL,
			GL_NOTEQUAL
		})
	);

	ADD_ARG_CASE1(depth_mask, "Test cost of glDepthMask() calls",
		depthMask,
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE1(stencil_mask, "Test cost of glStencilMask() calls",
		stencilMask,
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE1(clear_depth, "Test cost of glClearDepth() calls",
		clearDepthf,
		GLclampf,
		ARG_LIST({
			0.0f,
			0.5f,
			1.0f
		})
	);

	ADD_ARG_CASE1(clear_stencil, "Test cost of glClearStencil() calls",
		clearStencil,
		GLint,
		ARG_LIST({
			0,
			128,
			28
		})
	);

	ADD_ARG_CASE1(line_width, "Test cost of glLineWidth() calls",
		lineWidth,
		GLfloat,
		ARG_LIST({
			1.0f,
			0.5f,
			10.0f
		})
	);

	ADD_ARG_CASE1(cull_face, "Test cost of glCullFace() calls",
		cullFace,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		})
	);

	ADD_ARG_CASE1(front_face, "Test cost of glFrontFace() calls",
		frontFace,
		GLenum,
		ARG_LIST({
			GL_CCW,
			GL_CW
		})
	);

	ADD_ARG_CASE1(blend_equation, "Test cost of glBlendEquation() calls",
		blendEquation,
		GLenum,
		ARG_LIST({
			GL_FUNC_ADD,
			GL_FUNC_SUBTRACT,
			GL_FUNC_REVERSE_SUBTRACT
		})
	);

	ADD_ARG_CASE1(enable_vertex_attrib_array, "Test cost of glEnableVertexAttribArray() calls",
		enableVertexAttribArray,
		GLuint,
		ARG_LIST({
			0,
			1,
			2,
			3,
			4,
			5,
			6,
			7,
		})
	);

	ADD_ARG_CASE1(disable_vertex_attrib_array, "Test cost of glDisableVertexAttribArray() calls",
		disableVertexAttribArray,
		GLuint,
		ARG_LIST({
			0,
			1,
			2,
			3,
			4,
			5,
			6,
			7,
		})
	);

	ADD_ARG_CASE1(use_program, "Test cost of glUseProgram() calls. Note: Uses only program 0.",
		useProgram,
		GLuint,
		ARG_LIST({
			0,
		})
	);

	ADD_ARG_CASE1(active_texture, "Test cost of glActiveTexture() calls",
		activeTexture,
		GLenum,
		ARG_LIST({
			GL_TEXTURE0,
			GL_TEXTURE1,
			GL_TEXTURE2,
			GL_TEXTURE3,
			GL_TEXTURE4,
			GL_TEXTURE5,
			GL_TEXTURE6,
			GL_TEXTURE7
		})
	);

	ADD_ARG_CASE2(depth_range, "Test cost of glDepthRangef() calls",
		depthRangef,
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f
		})
	);

	ADD_ARG_CASE2(polygon_offset, "Test cost of glPolygonOffset() calls",
		polygonOffset,
		GLfloat,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			10.0f
		}),
		GLfloat,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			1000.0f
		})
	);

	ADD_ARG_CASE2(sample_coverage, "Test cost of glSampleCoverage() calls",
		sampleCoverage,
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.67f
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE2(blend_func, "Test cost of glBlendFunc() calls",
		blendFunc,
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		})
	);

	ADD_ARG_CASE2(blend_equation_separate, "Test cost of glBlendEquationSeparate() calls",
		blendEquationSeparate,
		GLenum,
		ARG_LIST({
			GL_FUNC_ADD,
			GL_FUNC_SUBTRACT,
			GL_FUNC_REVERSE_SUBTRACT
		}),
		GLenum,
		ARG_LIST({
			GL_FUNC_ADD,
			GL_FUNC_SUBTRACT,
			GL_FUNC_REVERSE_SUBTRACT
		})
	);

	ADD_ARG_CASE2(stencil_mask_separate, "Test cost of glStencilMaskSeparate() calls",
		stencilMaskSeparate,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE2(bind_buffer, "Test cost of glBindBuffer() calls. Note: Uses only buffer 0",
		bindBuffer,
		GLenum,
		ARG_LIST({
			GL_ELEMENT_ARRAY_BUFFER,
			GL_ARRAY_BUFFER
		}),
		GLuint,
		ARG_LIST({
			0
		})
	);

	ADD_ARG_CASE2(bind_texture, "Test cost of glBindTexture() calls. Note: Uses only texture 0",
		bindTexture,
		GLenum,
		ARG_LIST({
			GL_TEXTURE_2D,
			GL_TEXTURE_CUBE_MAP
		}),
		GLuint,
		ARG_LIST({
			0
		})
	);

	ADD_ARG_CASE2(hint, "Test cost of glHint() calls",
		hint,
		GLenum,
		ARG_LIST({
			GL_GENERATE_MIPMAP_HINT
		}),
		GLenum,
		ARG_LIST({
			GL_FASTEST,
			GL_NICEST,
			GL_DONT_CARE
		})
	);

	ADD_ARG_CASE3(stencil_func, "Test cost of glStencilFunc() calls",
		stencilFunc,
		GLenum,
		ARG_LIST({
			GL_NEVER,
			GL_ALWAYS,
			GL_LESS,
			GL_LEQUAL,
			GL_EQUAL,
			GL_GEQUAL,
			GL_GREATER,
			GL_NOTEQUAL
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7
		}),
		GLuint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7,
			0xFFFFFFFF
		})
	);

	ADD_ARG_CASE3(stencil_op, "Test cost of glStencilOp() calls",
		stencilOp,
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		})
	);

	ADD_ARG_CASE4(viewport, "Test cost of glViewport() calls",
		viewport,
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		})
	);

	ADD_ARG_CASE4(scissor, "Test cost of glScissor() calls",
		scissor,
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			100,
			1145235
		})
	);

	ADD_ARG_CASE4(stencil_func_separate, "Test cost of glStencilFuncSeparate() calls",
		stencilFuncSeparate,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		}),
		GLenum,
		ARG_LIST({
			GL_NEVER,
			GL_ALWAYS,
			GL_LESS,
			GL_LEQUAL,
			GL_EQUAL,
			GL_GEQUAL,
			GL_GREATER,
			GL_NOTEQUAL
		}),
		GLint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7
		}),
		GLuint,
		ARG_LIST({
			0,
			1,
			255,
			128,
			7,
			0xFFFFFFFF
		})
	);

	ADD_ARG_CASE4(stencil_op_separatae, "Test cost of glStencilOpSeparate() calls",
		stencilOpSeparate,
		GLenum,
		ARG_LIST({
			GL_FRONT,
			GL_BACK,
			GL_FRONT_AND_BACK
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		}),
		GLenum,
		ARG_LIST({
			GL_KEEP,
			GL_ZERO,
			GL_REPLACE,
			GL_INCR,
			GL_DECR,
			GL_INVERT,
			GL_INCR_WRAP,
			GL_DECR_WRAP
		})
	);

	ADD_ARG_CASE4(blend_func_separate, "Test cost of glBlendFuncSeparate() calls",
		blendFuncSeparate,
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		}),
		GLenum,
		ARG_LIST({
			GL_ZERO,
			GL_ONE,
			GL_SRC_COLOR,
			GL_ONE_MINUS_SRC_COLOR,
			GL_DST_COLOR,
			GL_ONE_MINUS_DST_COLOR,
			GL_SRC_ALPHA,
			GL_ONE_MINUS_SRC_ALPHA,
			GL_DST_ALPHA,
			GL_ONE_MINUS_DST_ALPHA,
			GL_CONSTANT_COLOR,
			GL_ONE_MINUS_CONSTANT_COLOR,
			GL_CONSTANT_ALPHA,
			GL_ONE_MINUS_CONSTANT_ALPHA
		})
	);

	ADD_ARG_CASE4(color_mask, "Test cost of glColorMask() calls",
		colorMask,
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		}),
		GLboolean,
		ARG_LIST({
			GL_TRUE,
			GL_FALSE
		})
	);

	ADD_ARG_CASE4(clear_color, "Test cost of glClearColor() calls",
		clearColor,
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		}),
		GLclampf,
		ARG_LIST({
			0.0f,
			1.0f,
			0.5f,
			0.33f
		})
	);

	ADD_ARG_CASE6(vertex_attrib_pointer, "Test cost of glVertexAttribPointer() calls",
		vertexAttribPointer,
		GLuint,
		ARG_LIST({
			0,
			1,
			2,
			3,
			4,
			5,
			6,
			7
		}),
		GLint,
		ARG_LIST({
			1,
			2,
			3,
			4
		}),
		GLenum,
		ARG_LIST({
			GL_UNSIGNED_BYTE,
			GL_BYTE,
			GL_UNSIGNED_SHORT,
			GL_SHORT,
			GL_FLOAT
		}),
		GLboolean,
		ARG_LIST({
			GL_FALSE,
			GL_TRUE
		}),
		GLsizei,
		ARG_LIST({
			0,
			2,
			4
		}),
		void*,
		ARG_LIST({
			(void*)(deUintptr)(0x0FF),
			(void*)(deUintptr)(0x0EF)
		})
	);
}